

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::IsConditionNonConstantLoopInvariant
          (LoopUnswitch *this,Instruction *insn)

{
  bool bVar1;
  Op OVar2;
  DefUseManager *this_00;
  Operand *pOVar3;
  uint *puVar4;
  Instruction *this_01;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_02;
  pointer entry;
  PostDominatorAnalysis *this_03;
  DominatorTree *post_dom_tree;
  Instruction *condition;
  DefUseManager *def_use_mgr;
  Instruction *insn_local;
  LoopUnswitch *this_local;
  
  bVar1 = opt::Instruction::IsBranch(insn);
  if (!bVar1) {
    __assert_fail("insn->IsBranch()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x225,
                  "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
                 );
  }
  OVar2 = opt::Instruction::opcode(insn);
  if (OVar2 != OpBranch) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    pOVar3 = opt::Instruction::GetOperand(insn,0);
    puVar4 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar3->words,0);
    this_01 = analysis::DefUseManager::GetDef(this_00,*puVar4);
    bVar1 = opt::Instruction::IsConstant(this_01);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = Loop::IsInsideLoop(this->loop_,this_01);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_02 = opt::Function::entry(this->function_);
        entry = std::
                unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ::get(this_02);
        this_03 = IRContext::GetPostDominatorAnalysis(this->context_,this->function_);
        post_dom_tree = DominatorAnalysisBase::GetDomTree(&this_03->super_DominatorAnalysisBase);
        this_local._7_1_ = IsDynamicallyUniform(this,this_01,entry,post_dom_tree);
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("insn->opcode() != spv::Op::OpBranch",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                ,0x226,
                "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsConditionNonConstantLoopInvariant(Instruction *)"
               );
}

Assistant:

bool IsConditionNonConstantLoopInvariant(Instruction* insn) {
    assert(insn->IsBranch());
    assert(insn->opcode() != spv::Op::OpBranch);
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    Instruction* condition = def_use_mgr->GetDef(insn->GetOperand(0).words[0]);
    if (condition->IsConstant()) {
      return false;
    }

    if (loop_->IsInsideLoop(condition)) {
      return false;
    }

    return IsDynamicallyUniform(
        condition, function_->entry().get(),
        context_->GetPostDominatorAnalysis(function_)->GetDomTree());
  }